

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O3

TV __thiscall Nova::Grid<float,_1>::Center(Grid<float,_1> *this,T_INDEX *index)

{
  Vector<float,_1,_true> *data_copy;
  T_STORAGE *in_RDI;
  T_STORAGE TVar1;
  
  TVar1._M_elems[0] =
       (_Type)(((float)(index->_data)._M_elems[0] + -0.5) * (this->dX)._data._M_elems[0] +
              (this->domain).min_corner._data._M_elems[0]);
  in_RDI->_M_elems[0] = (float)TVar1._M_elems[0];
  return (TV)TVar1._M_elems[0];
}

Assistant:

TV Center(const T_INDEX& index) const
    {
        return domain.min_corner+(TV(index)-(T).5)*dX;
    }